

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_rfid(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGContext_conflict10 *tcg_ctx_00;
  uintptr_t o;
  TCGv_i32 pTVar1;
  TCGTemp *args [1];
  TCGTemp *local_20;
  
  if (ctx->pr != true) {
    tcg_ctx = ctx->uc->tcg_ctx;
    if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
      pTVar1 = tcg_const_i32_ppc64(tcg_ctx,1);
      tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_st_i32,(TCGArg)(pTVar1 + (long)tcg_ctx),
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0xffffffffffffe3dc);
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    }
    if (ctx->has_cfar == true) {
      tcg_ctx_00 = ctx->uc->tcg_ctx;
      tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(cpu_cfar + (long)tcg_ctx_00),
                        (ctx->base).pc_next - 4);
    }
    local_20 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_rfid,(TCGTemp *)0x0,1,&local_20);
    ctx->exception = 0x202;
    return;
  }
  gen_exception_err(ctx,6,0x31);
  return;
}

Assistant:

static void gen_rfid(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    /* Restore CPU state */
    CHK_SV;
    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    gen_update_cfar(ctx, ctx->base.pc_next - 4);
    gen_helper_rfid(tcg_ctx, tcg_ctx->cpu_env);
    gen_sync_exception(ctx);
}